

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_band.c
# Opt level: O2

int check_matrix(SUNMatrix A,SUNMatrix B,realtype tol)

{
  double dVar1;
  double dVar2;
  SUNMatrix_ID SVar3;
  SUNMatrix_ID SVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  
  SVar3 = SUNMatGetID(A);
  SVar4 = SUNMatGetID(B);
  uVar10 = 1;
  if (SVar3 == SVar4) {
    lVar5 = SUNBandMatrix_Columns(A);
    lVar6 = SUNBandMatrix_Columns(B);
    if (lVar5 == lVar6) {
      lVar5 = SUNBandMatrix_Rows(A);
      lVar6 = SUNBandMatrix_Rows(B);
      if (lVar5 == lVar6) {
        lVar5 = SUNBandMatrix_LowerBandwidth(A);
        lVar6 = SUNBandMatrix_LowerBandwidth(B);
        if (lVar5 == lVar6) {
          lVar5 = SUNBandMatrix_UpperBandwidth(A);
          lVar6 = SUNBandMatrix_UpperBandwidth(B);
          if (lVar5 == lVar6) {
            uVar12 = 0;
            iVar13 = 0;
            while( true ) {
              lVar5 = SUNBandMatrix_Columns(A);
              if (lVar5 <= (long)uVar12) break;
              lVar5 = SUNBandMatrix_Column(A,uVar12);
              lVar6 = SUNBandMatrix_Column(B,uVar12);
              lVar7 = SUNBandMatrix_UpperBandwidth(A);
              uVar8 = uVar12;
              if (lVar7 <= (long)uVar12) {
                uVar8 = SUNBandMatrix_UpperBandwidth(A);
              }
              lVar7 = SUNBandMatrix_Columns(A);
              uVar9 = SUNBandMatrix_LowerBandwidth(A);
              if ((long)(~uVar9 + lVar7) < (long)uVar12) {
                lVar7 = SUNBandMatrix_Columns(A);
                lVar7 = ~uVar12 + lVar7;
              }
              else {
                lVar7 = SUNBandMatrix_LowerBandwidth(A);
              }
              for (lVar11 = -uVar8; lVar11 <= lVar7; lVar11 = lVar11 + 1) {
                dVar1 = *(double *)(lVar5 + lVar11 * 8);
                uVar10 = 1;
                if (!NAN(dVar1)) {
                  dVar2 = *(double *)(lVar6 + lVar11 * 8);
                  uVar10 = (uint)(tol < ABS((dVar1 - dVar2) / dVar2));
                }
                iVar13 = iVar13 + uVar10;
              }
              uVar12 = uVar12 + 1;
            }
            if (0 < iVar13) {
              puts("check_matrix failure, A = ");
              SUNBandMatrix_Print(A,_stdout);
              puts("B = ");
              SUNBandMatrix_Print(B,_stdout);
            }
            uVar10 = (uint)(0 < iVar13);
          }
        }
      }
    }
  }
  return uVar10;
}

Assistant:

int check_matrix(SUNMatrix A, SUNMatrix B, realtype tol)
{
  int failure = 0;
  sunindextype i, j, istart, iend;
  realtype *Acolj, *Bcolj;

  /* check matrix type and dimensions */
  if (SUNMatGetID(A) != SUNMatGetID(B))
    return 1;
  if (SUNBandMatrix_Columns(A) != SUNBandMatrix_Columns(B))
    return 1;
  if (SUNBandMatrix_Rows(A) != SUNBandMatrix_Rows(B))
    return 1;
  if (SUNBandMatrix_LowerBandwidth(A) != SUNBandMatrix_LowerBandwidth(B))
    return 1;
  if (SUNBandMatrix_UpperBandwidth(A) != SUNBandMatrix_UpperBandwidth(B))
    return 1;
  
  /* check matrix data */
  for (j=0; j<SUNBandMatrix_Columns(A); j++) {

    /* access matrix columns */
    Acolj = SUNBandMatrix_Column(A, j);
    Bcolj = SUNBandMatrix_Column(B, j);

    /* compare entries in this column */
    istart = (j<SUNBandMatrix_UpperBandwidth(A)) ? -j : -SUNBandMatrix_UpperBandwidth(A);
    iend = (j>SUNBandMatrix_Columns(A)-1-SUNBandMatrix_LowerBandwidth(A)) ?
      SUNBandMatrix_Columns(A)-1-j : SUNBandMatrix_LowerBandwidth(A);
    for (i=istart; i<=iend; i++)
      failure += FNEQ(Acolj[i], Bcolj[i], tol);
  }

  if (failure > ZERO) {
    printf("check_matrix failure, A = \n");
    SUNBandMatrix_Print(A, stdout);
    printf("B = \n");
    SUNBandMatrix_Print(B, stdout);
  }

    
  if (failure > ZERO)
    return(1);
  else
    return(0);
}